

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Mocap.cpp
# Opt level: O2

void __thiscall chrono::ChFunction_Mocap::ArchiveIN(ChFunction_Mocap *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_60;
  ChNameValue<int> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChFunction_Mocap>(marchive);
  ChFunction::ArchiveIN(&this->super_ChFunction,marchive);
  local_30._value = &this->samp_freq;
  local_30._name = "samp_freq";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->samples;
  local_48._name = "samples";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->timetot;
  local_60._name = "timetot";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  return;
}

Assistant:

void ChFunction_Mocap::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunction_Mocap>();
    // deserialize parent class
    ChFunction::ArchiveIN(marchive);
    // stream in all member data:
    ////marchive >> CHNVP(array_y);
    ////marchive >> CHNVP(array_y_dt);
    ////marchive >> CHNVP(array_y_dtdt);
    marchive >> CHNVP(samp_freq);
    marchive >> CHNVP(samples);
    marchive >> CHNVP(timetot);
}